

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O1

bool __thiscall
rapidjson::internal::
GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
::SearchWithAnchoring<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           *this,GenericStringStream<rapidjson::UTF8<char>_> *is,bool anchorBegin,bool anchorEnd)

{
  SizeType *pSVar1;
  uint uVar2;
  long lVar3;
  uint codepoint;
  bool bVar4;
  bool bVar5;
  long lVar6;
  Stack<rapidjson::CrtAllocator> *pSVar7;
  uint *puVar8;
  GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  *pGVar9;
  Stack<rapidjson::CrtAllocator> *l;
  bool bVar10;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_> ds;
  GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  *local_60;
  uint local_48 [2];
  ulong local_40;
  Stack<rapidjson::CrtAllocator> *local_38;
  
  local_48[0] = 0;
  bVar4 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is,local_48);
  if (!bVar4) {
    local_48[0] = 0;
  }
  *(undefined8 *)(this + 0x30) = *(undefined8 *)(this + 0x28);
  local_40 = (ulong)(*(int *)(*(long *)this + 0x74) + 0x1fU >> 3 & 0xfffffffc);
  memset(*(void **)(this + 0x78),0,local_40);
  bVar4 = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::AddState((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)this,(Stack<rapidjson::CrtAllocator> *)(this + 0x18),
                     *(SizeType *)(*(long *)this + 0x70));
  if ((*(long *)(this + 0x30) != *(long *)(this + 0x28)) && (bVar10 = local_48[0] == 0, !bVar10)) {
    pGVar9 = this + 0x28;
    local_60 = this + 0x30;
    pSVar7 = (Stack<rapidjson::CrtAllocator> *)(this + 0x18);
    l = (Stack<rapidjson::CrtAllocator> *)(this + 0x48);
    do {
      codepoint = local_48[0];
      bVar5 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is,local_48)
      ;
      if (!bVar5) {
        local_48[0] = 0;
      }
      if (bVar10) {
        return bVar4;
      }
      bVar4 = false;
      local_38 = pSVar7;
      memset(*(void **)(this + 0x78),0,local_40);
      l->stackTop_ = l->stack_;
      puVar8 = *(uint **)pGVar9;
      bVar10 = puVar8 == *(uint **)local_60;
      if (!bVar10) {
        bVar4 = false;
        do {
          if (*(uint *)(*(long *)this + 0x74) <= *puVar8) {
            __assert_fail("index < stateCount_",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                          ,0xaf,
                          "const State &rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::GetState(SizeType) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                         );
          }
          lVar3 = *(long *)(*(long *)this + 0x20);
          lVar6 = (ulong)*puVar8 * 0x10;
          pSVar1 = (SizeType *)(lVar3 + lVar6);
          uVar2 = *(uint *)(lVar3 + 0xc + lVar6);
          if ((uVar2 == 0xffffffff || uVar2 == codepoint) ||
             ((uVar2 == 0xfffffffe &&
              (bVar5 = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       ::MatchRange((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                     *)this,pSVar1[2],codepoint), bVar5)))) {
            bVar5 = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::AddState((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                *)this,l,*pSVar1);
            bVar4 = (bool)(bVar5 | bVar4);
            if ((anchorEnd) || (bVar4 == false)) goto LAB_0012f2db;
            bVar5 = false;
          }
          else {
LAB_0012f2db:
            bVar5 = true;
            if (!anchorBegin) {
              GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::AddState((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)this,l,*(SizeType *)(*(long *)this + 0x70));
            }
          }
          if (!bVar5) break;
          puVar8 = puVar8 + 1;
          bVar10 = puVar8 == *(uint **)local_60;
        } while (!bVar10);
      }
      if (!bVar10) {
        return true;
      }
      if (l->stackTop_ == l->stack_) {
        return bVar4;
      }
      local_60 = (GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                  *)&l->stackTop_;
      pGVar9 = (GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                *)&l->stack_;
      bVar10 = local_48[0] == 0;
      pSVar7 = l;
      l = local_38;
    } while (!bVar10);
  }
  return bVar4;
}

Assistant:

bool SearchWithAnchoring(InputStream& is, bool anchorBegin, bool anchorEnd) {
        DecodedStream<InputStream, Encoding> ds(is);

        state0_.Clear();
        Stack<Allocator> *current = &state0_, *next = &state1_;
        const size_t stateSetSize = GetStateSetSize();
        std::memset(stateSet_, 0, stateSetSize);

        bool matched = AddState(*current, regex_.root_);
        unsigned codepoint;
        while (!current->Empty() && (codepoint = ds.Take()) != 0) {
            std::memset(stateSet_, 0, stateSetSize);
            next->Clear();
            matched = false;
            for (const SizeType* s = current->template Bottom<SizeType>(); s != current->template End<SizeType>(); ++s) {
                const State& sr = regex_.GetState(*s);
                if (sr.codepoint == codepoint ||
                    sr.codepoint == RegexType::kAnyCharacterClass || 
                    (sr.codepoint == RegexType::kRangeCharacterClass && MatchRange(sr.rangeStart, codepoint)))
                {
                    matched = AddState(*next, sr.out) || matched;
                    if (!anchorEnd && matched)
                        return true;
                }
                if (!anchorBegin)
                    AddState(*next, regex_.root_);
            }
            internal::Swap(current, next);
        }

        return matched;
    }